

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteBinaryFooter(FBXExporter *this)

{
  shared_ptr<Assimp::IOStream> *psVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  StreamWriterLE outstream;
  
  psVar1 = &this->outfile;
  peVar2 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_IOStream[3])(peVar2,FBX::NULL_RECORD_abi_cxx11_,DAT_008ce928,1);
  peVar2 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_IOStream[3])(peVar2,FBX::GENERIC_FOOTID_abi_cxx11_,DAT_008ce9e8,1);
  iVar3 = (*((this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_IOStream[5])();
  for (uVar5 = CONCAT44(extraout_var,iVar3) | 0xfffffffffffffff0; uVar5 != 0; uVar5 = uVar5 + 1) {
    peVar2 = (psVar1->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1,1);
  }
  lVar4 = 4;
  while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
    peVar2 = (psVar1->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1,1);
  }
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_68,&psVar1->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter
            (&outstream,(shared_ptr<Assimp::IOStream> *)&_Stack_68,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  StreamWriter<false,_false>::Put<unsigned_int>(&outstream,0x1ce8);
  StreamWriter<false,_false>::~StreamWriter(&outstream);
  lVar4 = 0x78;
  while( true ) {
    peVar2 = (psVar1->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    bVar6 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar6) break;
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1,1);
  }
  (*peVar2->_vptr_IOStream[3])(peVar2,FBX::FOOT_MAGIC_abi_cxx11_,DAT_008cea08,1);
  return;
}

Assistant:

void FBXExporter::WriteBinaryFooter()
{
    outfile->Write(NULL_RECORD.c_str(), NULL_RECORD.size(), 1);

    outfile->Write(GENERIC_FOOTID.c_str(), GENERIC_FOOTID.size(), 1);

    // here some padding is added for alignment to 16 bytes.
    // if already aligned, the full 16 bytes is added.
    size_t pos = outfile->Tell();
    size_t pad = 16 - (pos % 16);
    for (size_t i = 0; i < pad; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // not sure what this is, but it seems to always be 0 in modern files
    for (size_t i = 0; i < 4; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // now the file version again
    {
        StreamWriterLE outstream(outfile);
        outstream.PutU4(EXPORT_VERSION_INT);
    } // StreamWriter destructor writes the data to the file

    // and finally some binary footer added to all files
    for (size_t i = 0; i < 120; ++i) {
        outfile->Write("\x00", 1, 1);
    }
    outfile->Write(FOOT_MAGIC.c_str(), FOOT_MAGIC.size(), 1);
}